

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::ReallocBuffer(FString *this,size_t newlen)

{
  char *__dest;
  FStringData *pFVar1;
  
  pFVar1 = (FStringData *)this->Chars;
  if (1 < pFVar1[-1].RefCount) {
    AllocBuffer(this,newlen);
    __dest = this->Chars;
    if (pFVar1[-1].Len < newlen) {
      newlen = (ulong)pFVar1[-1].Len;
    }
    memcpy(__dest,pFVar1,newlen);
    __dest[newlen] = '\0';
    FStringData::Release(pFVar1 + -1);
    return;
  }
  if (pFVar1[-1].AllocLen < newlen) {
    pFVar1 = FStringData::Realloc(pFVar1 + -1,newlen);
    pFVar1 = pFVar1 + 1;
    this->Chars = (char *)pFVar1;
  }
  pFVar1[-1].Len = (uint)newlen;
  return;
}

Assistant:

void FString::ReallocBuffer (size_t newlen)
{
	if (Data()->RefCount > 1)
	{ // If more than one reference, we must use a new copy
		FStringData *old = Data();
		AllocBuffer (newlen);
		StrCopy (Chars, old->Chars(), newlen < old->Len ? newlen : old->Len);
		old->Release();
	}
	else
	{
		if (newlen > Data()->AllocLen)
		{
			Chars = (char *)(Data()->Realloc(newlen) + 1);
		}
		Data()->Len = (unsigned int)newlen;
	}
}